

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_strtable_lookup2(upb_strtable *t,char *key,size_t len,upb_value *v)

{
  _Bool _Var1;
  uint32_t hash_00;
  lookupkey_t key_00;
  uint32_t hash;
  upb_value *v_local;
  size_t len_local;
  char *key_local;
  upb_strtable *t_local;
  
  hash_00 = _upb_Hash_NoSeed(key,len);
  key_00 = strkey2(key,len);
  _Var1 = lookup(&t->t,key_00,v,hash_00,streql);
  return _Var1;
}

Assistant:

bool upb_strtable_lookup2(const upb_strtable* t, const char* key, size_t len,
                          upb_value* v) {
  uint32_t hash = _upb_Hash_NoSeed(key, len);
  return lookup(&t->t, strkey2(key, len), v, hash, &streql);
}